

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void * __thiscall
mpt::content<mpt::message_store::entry>::insert(content<mpt::message_store::entry> *this,long pos)

{
  long local_20;
  long pos_local;
  content<mpt::message_store::entry> *this_local;
  
  local_20 = pos;
  if ((pos < 0) && (local_20 = ((this->super_buffer)._used >> 3) + pos, local_20 < 0)) {
    this_local = (content<mpt::message_store::entry> *)0x0;
  }
  else {
    this_local = (content<mpt::message_store::entry> *)
                 buffer::insert(&this->super_buffer,local_20 << 3,8);
  }
  return this_local;
}

Assistant:

void *insert(long pos)
	{
		if (pos < 0) {
			pos += _used / sizeof(T);
			if (pos < 0) {
				return 0;
			}
		}
		/* inserted data is NOT initialized */
		return buffer::insert(pos * sizeof(T), sizeof(T));
	}